

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O1

bool __thiscall solitaire::Solitaire::isGameFinished(Solitaire *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  iVar1 = (*(((this->foundationPiles)._M_elems[0].
              super___shared_ptr<solitaire::piles::interfaces::FoundationPile,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->super_Archiver)._vptr_Archiver[7])();
  if (((((CONCAT44(extraout_var,iVar1) & 0x1ffffffff) == 0x10000000c) &&
       (iVar1 = (*(((this->foundationPiles)._M_elems[1].
                    super___shared_ptr<solitaire::piles::interfaces::FoundationPile,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_Archiver)._vptr_Archiver[7])(),
       (CONCAT44(extraout_var_00,iVar1) & 0x1ffffffff) == 0x10000000c)) &&
      (iVar1 = (*(((this->foundationPiles)._M_elems[2].
                   super___shared_ptr<solitaire::piles::interfaces::FoundationPile,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_Archiver)._vptr_Archiver[7])(),
      (CONCAT44(extraout_var_01,iVar1) & 0x1ffffffff) == 0x10000000c)) &&
     (iVar1 = (*(((this->foundationPiles)._M_elems[3].
                  super___shared_ptr<solitaire::piles::interfaces::FoundationPile,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_Archiver)._vptr_Archiver[7])(),
     (CONCAT44(extraout_var_02,iVar1) & 0x1ffffffff) == 0x10000000c)) {
    return true;
  }
  return false;
}

Assistant:

bool Solitaire::isGameFinished() const {
    return std::all_of(foundationPiles.begin(), foundationPiles.end(),
        [](const auto& pile) {
            return pile->getTopCardValue() == Value::King;
        }
    );
}